

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O2

void jhu::thrax::anon_unknown_10::expectNode(IndexType s,IndexType e,char *l,Node *n,Node actual)

{
  char *pcVar1;
  AssertHelper AStack_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertionResult gtest_ar;
  Node *n_local;
  char *l_local;
  Span sp;
  
  n_local = n;
  l_local = l;
  sp.start = s;
  sp.end = e;
  testing::internal::CmpHelperEQ<jhu::thrax::Span,jhu::thrax::Span>
            ((internal *)&gtest_ar,"sp","actual.span",&sp,&actual.span);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0xb,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
            ((internal *)&gtest_ar,"l","actual.label",&l_local,&actual.label);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0xc,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<jhu::thrax::Node_const*,jhu::thrax::Node*>
            ((internal *)&gtest_ar,"n","actual.parent",&n_local,&actual.parent);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0xd,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void expectNode(
    IndexType s, IndexType e, const char*l, const Node* n, Node actual) {
  Span sp{ s, e };
  EXPECT_EQ(sp, actual.span);
  EXPECT_EQ(l, actual.label);
  EXPECT_EQ(n, actual.parent);
}